

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O3

bool __thiscall Button::onPointerEvent(Button *this,PointerEvent *e)

{
  undefined1 *puVar1;
  Type TVar2;
  StandardSurface *pSVar3;
  bool bVar4;
  SurfaceBackendImpl *pSVar5;
  rect2d local_28;
  
  TVar2 = (e->super_Event).m_type;
  if (TVar2 == PointerMove) {
    local_28.tl = *(vec2 *)&(this->super_RectangleNodeBase).super_Node.field_0x34;
    local_28.br.x = *(float *)&(this->super_RectangleNodeBase).field_0x3c;
    local_28.br.y = *(float *)&(this->super_RectangleNodeBase).field_0x40;
    bVar4 = rengine::rect2d::contains(&local_28,*(vec2 *)&(e->super_Event).field_0xc);
    pSVar3 = this->m_surface;
    if (!bVar4) {
      pSVar3->m_pointerEventReceiver = (Node *)0x0;
      if (this->m_state != DefaultState) {
        this->m_state = DefaultState;
        puVar1 = &(this->super_RectangleNodeBase).super_Node.field_0x31;
        *puVar1 = *puVar1 | 1;
        (*((pSVar3->super_Surface).m_impl)->_vptr_SurfaceBackendImpl[8])();
      }
      return false;
    }
    pSVar3->m_pointerEventReceiver = (Node *)this;
    if (this->m_state == HoveredState) {
      return true;
    }
    this->m_state = HoveredState;
    puVar1 = &(this->super_RectangleNodeBase).super_Node.field_0x31;
    *puVar1 = *puVar1 | 1;
    pSVar5 = (pSVar3->super_Surface).m_impl;
  }
  else {
    if (TVar2 == PointerUp) {
      if (this->m_state != HoveredState) {
        this->m_state = HoveredState;
        puVar1 = &(this->super_RectangleNodeBase).super_Node.field_0x31;
        *puVar1 = *puVar1 | 1;
        (*((this->m_surface->super_Surface).m_impl)->_vptr_SurfaceBackendImpl[8])();
      }
      rengine::Signal<>::emit(&onClicked,(SignalEmitter *)this);
      return true;
    }
    if (TVar2 != PointerDown) {
      return true;
    }
    if (this->m_state == PressedState) {
      return true;
    }
    this->m_state = PressedState;
    puVar1 = &(this->super_RectangleNodeBase).super_Node.field_0x31;
    *puVar1 = *puVar1 | 1;
    pSVar5 = (this->m_surface->super_Surface).m_impl;
  }
  (*pSVar5->_vptr_SurfaceBackendImpl[8])();
  return true;
}

Assistant:

bool Button::onPointerEvent(PointerEvent *e)
{
    if (e->type() == Event::PointerDown) {
        setState(PressedState);
    } else if (e->type() == Event::PointerUp) {
        setState(HoveredState);
        onClicked.emit(this);
    } else if (e->type() == Event::PointerMove) {
        if (geometry().contains(e->position())) {
            m_surface->setPointerEventReceiver(this);
            setState(HoveredState);
        } else {
            m_surface->setPointerEventReceiver(nullptr);
            setState(DefaultState);
            return false;
        }
    }

    return true;
}